

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ay8910.c
# Opt level: O1

UINT32 ay8910_start(void **chip,UINT32 clock,UINT8 ay_type,UINT8 ay_flags)

{
  double dVar1;
  int iVar2;
  int iVar3;
  ay8910_context *psg;
  void *pvVar4;
  undefined1 uVar5;
  ulong uVar6;
  uint uVar7;
  UINT32 UVar8;
  ay_ym_param *paVar9;
  undefined1 uVar10;
  ay_ym_param *paVar11;
  long lVar12;
  long lVar13;
  int chan;
  long lVar14;
  long lVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double local_128 [33];
  
  pvVar4 = calloc(1,0x2f8);
  if (pvVar4 == (void *)0x0) {
    UVar8 = 0;
  }
  else {
    *chip = pvVar4;
    *(undefined8 *)((long)pvVar4 + 0x2e8) = 0;
    *(UINT32 *)((long)pvVar4 + 0x2e0) = clock;
    *(UINT8 *)((long)pvVar4 + 0x2e5) = ay_flags;
    *(UINT8 *)((long)pvVar4 + 0x2e4) = ay_type;
    uVar6 = 0x10;
    if ((ay_type & 0xf0) != 0x20) {
      uVar6 = (ulong)ay_type;
    }
    if (((byte)uVar6 < 0x14) && ((0xf001fU >> ((uint)uVar6 & 0x1f) & 1) != 0)) {
      uVar7 = *(uint *)(&DAT_0017d578 + uVar6 * 4);
      uVar5 = (&DAT_0017d5c8)[uVar6];
      uVar10 = (&DAT_0017d5dc)[uVar6];
    }
    else {
      uVar7 = (uint)(0xf < (byte)uVar6);
      uVar10 = 2;
      uVar5 = 3;
    }
    *(uint *)((long)pvVar4 + 0x20) = uVar7;
    *(undefined1 *)((long)pvVar4 + 0x24) = uVar5;
    *(undefined1 *)((long)pvVar4 + 0x25) = uVar10;
    bVar16 = uVar7 == 0;
    paVar9 = &ym2149_param;
    if (bVar16) {
      paVar9 = &ay8910_param;
    }
    paVar11 = &ym2149_param_env;
    if (bVar16) {
      paVar11 = &ay8910_param;
    }
    *(bool *)((long)pvVar4 + 0x6c) = bVar16;
    *(uint *)((long)pvVar4 + 0x68) = bVar16 + 1;
    *(ay_ym_param **)((long)pvVar4 + 0x70) = paVar9;
    *(ay_ym_param **)((long)pvVar4 + 0x78) = paVar11;
    *(byte *)((long)pvVar4 + 100) = !bVar16 << 4 | 0xf;
    *(undefined4 *)((long)pvVar4 + 0x2cc) = 1000;
    *(undefined8 *)((long)pvVar4 + 0x2c4) = 0x3e8000003e8;
    *(byte *)((long)pvVar4 + 0x2d0) = (byte)~ay_flags >> 6 | 1;
    *(undefined1 *)((long)pvVar4 + 0x2d1) = 3;
    *(byte *)((long)pvVar4 + 0x2d2) = (byte)~ay_flags >> 7 | 2;
    lVar12 = (long)pvVar4 + 0x80;
    lVar13 = (long)pvVar4 + 0x140;
    lVar14 = 0;
    do {
      iVar2 = paVar9->res_count;
      if ((long)iVar2 < 1) {
        dVar17 = 0.0;
        dVar18 = 10.0;
      }
      else {
        iVar3 = *(int *)((long)pvVar4 + lVar14 * 4 + 0x2c4);
        dVar1 = paVar9->r_down;
        lVar15 = 0;
        dVar19 = 0.0;
        dVar20 = 10.0;
        do {
          dVar17 = 1.0 / paVar9->res[lVar15];
          dVar18 = 1.0 / (double)iVar3 + 1.0 / dVar1 + dVar17;
          if (!bVar16 || lVar15 != 0) {
            dVar21 = 1.0 / paVar9->r_up;
            dVar17 = dVar17 + dVar21;
            dVar18 = dVar18 + dVar21;
          }
          dVar17 = dVar17 / dVar18;
          local_128[lVar15] = dVar17;
          dVar18 = dVar17;
          if (dVar20 <= dVar17) {
            dVar18 = dVar20;
          }
          if (dVar17 <= dVar19) {
            dVar17 = dVar19;
          }
          lVar15 = lVar15 + 1;
          dVar19 = dVar17;
          dVar20 = dVar18;
        } while (iVar2 != lVar15);
      }
      if (0 < iVar2) {
        lVar15 = 0;
        do {
          *(int *)(lVar12 + lVar15 * 4) =
               (int)((((local_128[lVar15] - dVar18) / (dVar17 - dVar18)) * 16384.0) / 3.0);
          lVar15 = lVar15 + 1;
        } while (lVar15 < paVar9->res_count);
      }
      iVar2 = paVar11->res_count;
      if ((long)iVar2 < 1) {
        dVar17 = 0.0;
        dVar18 = 10.0;
      }
      else {
        iVar3 = *(int *)((long)pvVar4 + lVar14 * 4 + 0x2c4);
        dVar1 = paVar11->r_down;
        dVar21 = 1.0 / paVar11->r_up;
        lVar15 = 0;
        dVar19 = 0.0;
        dVar20 = 10.0;
        do {
          dVar17 = 1.0 / paVar11->res[lVar15];
          dVar17 = (dVar17 + dVar21) / (1.0 / (double)iVar3 + 1.0 / dVar1 + dVar17 + dVar21);
          local_128[lVar15] = dVar17;
          dVar18 = dVar17;
          if (dVar20 <= dVar17) {
            dVar18 = dVar20;
          }
          if (dVar17 <= dVar19) {
            dVar17 = dVar19;
          }
          lVar15 = lVar15 + 1;
          dVar19 = dVar17;
          dVar20 = dVar18;
        } while (iVar2 != lVar15);
      }
      if (0 < iVar2) {
        lVar15 = 0;
        do {
          *(int *)(lVar13 + lVar15 * 4) =
               (int)((((local_128[lVar15] - dVar18) / (dVar17 - dVar18)) * 16384.0) / 3.0);
          lVar15 = lVar15 + 1;
        } while (lVar15 < paVar11->res_count);
      }
      lVar14 = lVar14 + 1;
      lVar12 = lVar12 + 0x40;
      lVar13 = lVar13 + 0x80;
    } while (lVar14 != 3);
    *(undefined4 *)((long)pvVar4 + 0x2dc) = 0xffffffff;
    *(undefined8 *)((long)pvVar4 + 0x2d4) = 0xffffffffffffffff;
    uVar7 = *(uint *)((long)pvVar4 + 0x2e0);
    if (*(int *)((long)pvVar4 + 0x20) == 1) {
      uVar7 = uVar7 >> (*(byte *)((long)pvVar4 + 0x2e5) >> 4 & 1);
    }
    UVar8 = uVar7 >> 3;
  }
  return UVar8;
}

Assistant:

UINT32 ay8910_start(void **chip, UINT32 clock, UINT8 ay_type, UINT8 ay_flags)
{
	ay8910_context *info;

	info = (ay8910_context*)calloc(1, sizeof(ay8910_context));
	if (info == NULL)
		return 0;
	*chip = info;

	info->SmpRateFunc = NULL;

	info->clock = clock;
	info->chip_flags = ay_flags;
	ay8910_set_type(info, ay_type);
	info->res_load[0] = info->res_load[1] = info->res_load[2] = 1000; //Default values for resistor loads
	
	if (info->chip_flags & AY8910_ZX_STEREO)
	{
		// ABC Stereo
		info->StereoMask[0] = 0x01;
		info->StereoMask[1] = 0x03;
		info->StereoMask[2] = 0x02;
	}
	else
	{
		info->StereoMask[0] = 0x03;
		info->StereoMask[1] = 0x03;
		info->StereoMask[2] = 0x03;
	}

	build_mixer_table(info);

	//ay8910_set_clock(info, clock);
	ay8910_set_mute_mask(info, 0x00);

	return ay8910_get_sample_rate(info);
}